

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gui.cpp
# Opt level: O2

void __thiscall gui::Gui::draw(Gui *this,RenderTarget *target,RenderStates states)

{
  RenderTexture *this_00;
  pointer psVar1;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *pvVar2;
  shared_ptr<gui::Widget> *child;
  pointer psVar3;
  Color local_34;
  
  if (this->redrawPending_ == true) {
    this_00 = &this->renderTexture_;
    sf::Color::Color(&local_34,'\0','\0','\0','\0');
    sf::RenderTarget::clear(&this_00->super_RenderTarget,&local_34);
    pvVar2 = ContainerBase::getChildren(&this->super_ContainerBase);
    psVar1 = (pvVar2->
             super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (psVar3 = (pvVar2->
                  super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1)
    {
      sf::RenderTarget::draw
                (&this_00->super_RenderTarget,
                 &((psVar3->super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  super_Drawable,(RenderStates *)sf::RenderStates::Default);
    }
    sf::RenderTexture::display(this_00);
    this->redrawPending_ = false;
  }
  sf::RenderTarget::draw(target,&(this->renderSprite_).super_Drawable,&states);
  return;
}

Assistant:

void Gui::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (redrawPending_) {
        GUI_DEBUG << "Gui redraw...\n";
        renderTexture_.clear({0, 0, 0, 0});
        for (const auto& child : getChildren()) {
            renderTexture_.draw(*child);
        }
        renderTexture_.display();
        redrawPending_ = false;
    }

    target.draw(renderSprite_, states);
}